

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

bool __thiscall qpdf::Tokenizer::getToken(Tokenizer *this,Token *token,bool *unread_char,char *ch)

{
  state_e sVar1;
  token_type_e type;
  byte bVar2;
  bool bVar3;
  string sStack_118;
  string local_f8;
  string local_d8;
  string local_b8;
  Token local_98;
  
  sVar1 = this->state;
  bVar2 = false;
  if (this->in_token == false) {
    bVar2 = this->before_token ^ 1;
  }
  *unread_char = (bool)bVar2;
  *ch = this->char_to_unread;
  if (sVar1 == st_token_ready) {
    type = this->type;
    bVar3 = (type | tt_array_open) != tt_string;
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_b8,(string *)&this->raw_val);
      std::__cxx11::string::string((string *)&local_f8,(string *)&this->error_message);
      QPDFTokenizer::Token::Token(&local_98,type,&this->raw_val,&local_b8,&local_f8);
    }
    else {
      std::__cxx11::string::string((string *)&local_d8,(string *)&this->raw_val);
      std::__cxx11::string::string((string *)&sStack_118,(string *)&this->error_message);
      QPDFTokenizer::Token::Token(&local_98,type,&this->val,&local_d8,&sStack_118);
    }
    QPDFTokenizer::Token::operator=(token,&local_98);
    QPDFTokenizer::Token::~Token(&local_98);
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      std::__cxx11::string::~string((string *)&sStack_118);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    reset(this);
  }
  return sVar1 == st_token_ready;
}

Assistant:

bool
Tokenizer::getToken(Token& token, bool& unread_char, char& ch)
{
    bool ready = (state == st_token_ready);
    unread_char = !in_token && !before_token;
    ch = char_to_unread;
    if (ready) {
        token = (!(type == tt::tt_name || type == tt::tt_string))
            ? Token(type, raw_val, raw_val, error_message)
            : Token(type, val, raw_val, error_message);

        reset();
    }
    return ready;
}